

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void close_socket(DESCRIPTOR_DATA *dclose)

{
  int min_level;
  DESCRIPTOR_DATA *pDVar1;
  DESCRIPTOR_DATA *pDVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  CHAR_DATA *pCVar6;
  string_view fmt;
  string_view fmt_00;
  char buf [4608];
  char acStack_1228 [4608];
  
  if (0 < dclose->outtop) {
    process_output(dclose,false);
  }
  pDVar1 = descriptor_list;
  if (dclose->snoop_by != (DESCRIPTOR_DATA *)0x0) {
    write_to_buffer(dclose->snoop_by,"Your victim has left the game.\n\r",0);
    pDVar1 = descriptor_list;
  }
  for (; pDVar1 != (DESCRIPTOR_DATA *)0x0; pDVar1 = pDVar1->next) {
    if (pDVar1->snoop_by == dclose) {
      pDVar1->snoop_by = (DESCRIPTOR_DATA *)0x0;
    }
  }
  pCVar6 = dclose->character;
  if (pCVar6 != (CHAR_DATA *)0x0) {
    fmt._M_str = "Closing link to {}.";
    fmt._M_len = 0x13;
    CLogger::Info<char*&>((CLogger *)&RS.field_0x140,fmt,&pCVar6->name);
    if ((dclose->connected == 0) && (merc_down == false)) {
      uVar5 = (int)current_time - (int)pCVar6->last_fight_time;
      if (pCVar6->invis_level < 0x33) {
        act_new("$n has lost $s link.",pCVar6,(void *)0x0,(void *)0x0,0,5);
      }
      pcVar4 = "nobody";
      if (pCVar6->last_fight_name != (char *)0x0) {
        pcVar4 = pCVar6->last_fight_name;
      }
      if (pCVar6->last_fight_time == 0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = (ulong)uVar5;
        if (600 < (int)uVar5) {
          uVar3 = (ulong)uVar5 / 0x3c;
        }
      }
      sprintf(acStack_1228,"$N has lost $S link (Last fought %s %d %s ago).",pcVar4,uVar3);
      min_level = get_trust(pCVar6);
      wiznet(acStack_1228,pCVar6,(OBJ_DATA *)0x0,4,0,min_level);
      pCVar6->desc = (DESCRIPTOR_DATA *)0x0;
    }
    else {
      pCVar6 = dclose->original;
      if (pCVar6 == (CHAR_DATA *)0x0) {
        pCVar6 = dclose->character;
      }
      free_char(pCVar6);
    }
  }
  if (d_next == dclose) {
    d_next = d_next->next;
  }
  pDVar1 = descriptor_list;
  if (descriptor_list == dclose) {
    descriptor_list = descriptor_list->next;
  }
  else {
    do {
      pDVar2 = pDVar1;
      if (pDVar2 == (DESCRIPTOR_DATA *)0x0) {
        fmt_00._M_str = "Close_socket: dclose not found.";
        fmt_00._M_len = 0x1f;
        CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_00);
        goto LAB_00279e42;
      }
      pDVar1 = pDVar2->next;
    } while (pDVar2->next != dclose);
    pDVar2->next = dclose->next;
  }
LAB_00279e42:
  close((int)dclose->descriptor);
  free_descriptor(dclose);
  return;
}

Assistant:

void close_socket(DESCRIPTOR_DATA *dclose)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH];

	if (dclose->outtop > 0)
		process_output(dclose, false);

	if (dclose->snoop_by != nullptr)
	{
		write_to_buffer(dclose->snoop_by, "Your victim has left the game.\n\r", 0);
	}

	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == dclose)
				d->snoop_by = nullptr;
		}
	}

	if ((ch = dclose->character) != nullptr)
	{
		RS.Logger.Info("Closing link to {}.", ch->name);

		/* cut down on wiznet spam when rebooting */
		if (dclose->connected == CON_PLAYING && !merc_down)
		{
			int ftime = current_time - ch->last_fight_time;
			if (ch->invis_level < 51)
				act("$n has lost $s link.", ch, nullptr, nullptr, TO_ROOM);

			sprintf(buf, "$N has lost $S link (Last fought %s %d %s ago).",
				ch->last_fight_name != nullptr ? ch->last_fight_name : "nobody",
				ch->last_fight_time ? ftime > 600 ? (int)(ftime / 60) : ftime : -1,
				ftime > 600 ? "minutes" : "seconds");
			wiznet(buf, ch, nullptr, WIZ_LINKS, 0, get_trust(ch));

			ch->desc = nullptr;
		}
		else
		{
			free_char(dclose->original ? dclose->original : dclose->character);
		}
	}

	if (d_next == dclose)
		d_next = d_next->next;

	if (dclose == descriptor_list)
	{
		descriptor_list = descriptor_list->next;
	}
	else
	{
		DESCRIPTOR_DATA *d;

		for (d = descriptor_list; d && d->next != dclose; d = d->next);

		if (d != nullptr)
			d->next = dclose->next;
		else
			RS.Logger.Warn("Close_socket: dclose not found.");
	}

	close(dclose->descriptor);
	free_descriptor(dclose);
	return;
}